

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::MicrosecondsFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  ScalarFunctionSet *in_RDI;
  function_statistics_t ts_stats;
  scalar_function_t local_b8;
  scalar_function_t local_98;
  scalar_function_t local_78;
  scalar_function_t local_58;
  LogicalType local_38;
  
  ts_stats = (function_statistics_t)0x1acdf72;
  LogicalType::LogicalType(&local_38,BIGINT);
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::MicrosecondsOperator>;
  local_58._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_58.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::MicrosecondsOperator>;
  local_78._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::MicrosecondsOperator>
  ;
  local_98._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::MicrosecondsOperator>;
  local_b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::MicrosecondsOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = &stack0xffffffffffffff28;
  timetz_func.super__Function_base._M_manager =
       DatePart::MicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker = DatePart::MicrosecondsOperator::PropagateStatistics<duckdb::dtime_t>;
  GetGenericTimePartFunction
            (in_RDI,&local_38,&local_58,&local_78,&local_98,&local_b8,timetz_func,
             DatePart::MicrosecondsOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             ScalarFunction::
             UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::MicrosecondsOperator>,
             (function_statistics_t)0x0);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff28,(_Any_data *)&stack0xffffffffffffff28,
               __destroy_functor);
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_38);
  return in_RDI;
}

Assistant:

ScalarFunctionSet MicrosecondsFun::GetFunctions() {
	return GetTimePartFunction<DatePart::MicrosecondsOperator>();
}